

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

float __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,int idx)

{
  double dVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  float fVar4;
  stringc c;
  string<char> local_18;
  
  iVar3 = (*(this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,CONCAT44(in_register_00000034,idx));
  if ((unsigned_short *)CONCAT44(extraout_var,iVar3) == (unsigned_short *)0x0) {
    fVar4 = 0.0;
  }
  else {
    local_18.array = (char *)0x0;
    local_18.allocated = 0;
    local_18.used = 0;
    core::string<char>::operator=(&local_18,(unsigned_short *)CONCAT44(extraout_var,iVar3));
    pcVar2 = local_18.array;
    dVar1 = atof(local_18.array);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    fVar4 = (float)dVar1;
  }
  return fVar4;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
        return static_cast<float>(atof(c.c_str()));
		//return fast_atof(c.c_str());
	}